

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

bool __thiscall QRenderRule::baseStyleCanDraw(QRenderRule *this)

{
  QStyleSheetBackgroundData *pQVar1;
  char cVar2;
  bool bVar3;
  
  bVar3 = true;
  if (((this->bg).d.ptr != (QStyleSheetBackgroundData *)0x0) &&
     ((cVar2 = QPixmap::isNull(), cVar2 == '\0' ||
      (*(int *)(*(long *)&((this->bg).d.ptr)->brush + 4) != 0)))) {
    if ((*(int *)(*(long *)&((this->bg).d.ptr)->brush + 4) == 0) &&
       (cVar2 = QPixmap::isNull(), cVar2 != '\0')) {
      return true;
    }
    if (((this->bg).d.ptr != (QStyleSheetBackgroundData *)0x0) &&
       (cVar2 = QPixmap::isNull(), cVar2 == '\0')) {
      return false;
    }
    pQVar1 = (this->bg).d.ptr;
    if ((pQVar1 == (QStyleSheetBackgroundData *)0x0) ||
       (2 < *(int *)(*(long *)&pQVar1->brush + 4) - 0xfU)) {
      bVar3 = (bool)((byte)this->features & 1);
    }
    else {
      bVar3 = (bool)(((byte)this->features & 2) >> 1);
    }
  }
  return bVar3;
}

Assistant:

bool baseStyleCanDraw() const {
        if (!hasBackground() || (background()->brush.style() == Qt::NoBrush && bg->pixmap.isNull()))
            return true;
        if (bg && !bg->pixmap.isNull())
            return false;
        if (hasGradientBackground())
            return features & StyleFeature_BackgroundGradient;
        return features & StyleFeature_BackgroundColor;
    }